

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O3

wchar_t cmd_get_arg_choice(command_conflict *cmd,char *arg,int *choice)

{
  int iVar1;
  long lVar2;
  char *__s1;
  
  __s1 = cmd->arg[0].name;
  lVar2 = 4;
  do {
    iVar1 = strcmp(__s1,arg);
    if (iVar1 == 0) {
      if (((cmd_arg *)(__s1 + -0x10))->type != arg_CHOICE) {
        return L'\xfffffffe';
      }
      *choice = ((cmd_arg_data_conflict *)(__s1 + -8))->choice;
      return L'\0';
    }
    __s1 = __s1 + 0x28;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  return L'\xffffffff';
}

Assistant:

int cmd_get_arg_choice(struct command *cmd, const char *arg, int *choice)
{
	union cmd_arg_data data;
	int err;

	if ((err = cmd_get_arg(cmd, arg, arg_CHOICE, &data)) == CMD_OK)
		*choice = data.choice;

	return err;
}